

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

int av1_tpl_setup_stats(AV1_COMP *cpi,int gop_eval,EncodeFrameParams *frame_params)

{
  TplParams *tpl_data;
  scale_factors *sf;
  FRAME_TYPE FVar1;
  TX_SIZE tx_size;
  byte bVar2;
  byte bVar3;
  FRAME_UPDATE_TYPE type;
  aom_enc_pass aVar4;
  uint uVar5;
  AV1_PRIMARY *pAVar6;
  RefCntBuffer *pRVar7;
  TplDepFrame *pTVar8;
  TplDepFrame *pTVar9;
  TplDepFrame *pTVar10;
  STATS_BUFFER_CTX *pSVar11;
  uint uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  MACROBLOCK *x;
  TplBuffers *tpl_tmp_buffers;
  bool bVar16;
  byte bVar17;
  int i_1;
  int iVar18;
  int iVar19;
  uint uVar20;
  undefined1 *puVar21;
  lookahead_entry *plVar22;
  YV12_BUFFER_CONFIG *pYVar23;
  uint8_t *puVar24;
  int16_t *piVar25;
  tran_low_t *ptVar26;
  BLOCK_SIZE bsize;
  int iVar27;
  int iVar28;
  long lVar29;
  RefCntBuffer **ppRVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  uint32_t uVar34;
  AV1_PRIMARY *pAVar35;
  int iVar36;
  int iVar37;
  EncodeFrameParams *pEVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  int *piVar42;
  MB_MODE_INFO *pMVar43;
  AV1_PRIMARY *pAVar44;
  FIRSTPASS_STATS *pFVar45;
  byte bVar46;
  int i;
  uint uVar47;
  ulong uVar48;
  FIRSTPASS_STATS *pFVar49;
  uint uVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  ulong uVar54;
  bool bVar55;
  bool bVar56;
  double dVar57;
  double dVar58;
  int num_arf_layers;
  int remapped_ref_idx [8];
  RefFrameMapPair ref_frame_map_pairs [8];
  ThreadData_conflict *td;
  int ref_picture_map [8];
  EncodeFrameParams frame_params_1;
  EncodeFrameParams this_frame_params;
  uint auStackY_1e1f8 [30668];
  ulong local_298;
  long local_280;
  int local_250;
  uint32_t local_208 [8];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  MACROBLOCK *local_1a8;
  TplBuffers *local_1a0;
  MB_MODE_INFO_EXT *local_198;
  double *local_190;
  int *local_188;
  TileInfo *local_180;
  long local_178;
  long local_170;
  MB_MODE_INFO *local_168 [5];
  FRAME_DIFF local_140;
  MB_MODE_INFO local_130;
  int local_7c [17];
  RefreshFrameInfo local_38 [2];
  
  bVar46 = 0;
  pAVar6 = cpi->ppi;
  pEVar38 = frame_params;
  piVar42 = local_7c;
  for (lVar29 = 0x13; lVar29 != 0; lVar29 = lVar29 + -1) {
    *piVar42 = pEVar38->error_resilient_mode;
    pEVar38 = (EncodeFrameParams *)&pEVar38->frame_type;
    piVar42 = piVar42 + 1;
  }
  tpl_data = &pAVar6->tpl_data;
  if (cpi->superres_mode == AOM_SUPERRES_NONE) {
    (cpi->common).current_frame.frame_type = frame_params->frame_type;
    uVar54 = (ulong)cpi->gf_frame_index;
    pAVar35 = pAVar6;
    if ((int)(uint)cpi->gf_frame_index < (pAVar6->gf_group).size) {
      do {
        (cpi->common).current_frame.frame_type = (pAVar6->gf_group).frame_type[uVar54];
        av1_configure_buffer_updates
                  (cpi,local_38,(pAVar6->gf_group).update_type[uVar54],
                   (pAVar6->gf_group).refbuf_state[uVar54],0);
        (cpi->refresh_frame).alt_ref_frame = local_38[0].alt_ref_frame;
        (cpi->refresh_frame).golden_frame = local_38[0].golden_frame;
        (cpi->refresh_frame).bwd_ref_frame = local_38[0].bwd_ref_frame;
        uVar54 = uVar54 + 1;
      } while ((int)uVar54 < (pAVar6->gf_group).size);
      pAVar35 = cpi->ppi;
      uVar54 = (ulong)cpi->gf_frame_index;
    }
    if ((pAVar35->gf_group).update_type[uVar54] == '\0') {
      local_1b8._8_4_ = 0xffffffff;
      local_1b8._0_8_ = 0xffffffffffffffff;
      local_1b8._12_4_ = 0xffffffff;
      local_1c8._8_4_ = 0xffffffff;
      local_1c8._0_8_ = 0xffffffffffffffff;
      local_1c8._12_4_ = 0xffffffff;
      local_1d8._8_4_ = 0xffffffff;
      local_1d8._0_8_ = 0xffffffffffffffff;
      local_1d8._12_4_ = 0xffffffff;
      local_1e8._8_4_ = 0xffffffff;
      local_1e8._0_8_ = 0xffffffffffffffff;
      local_1e8._12_4_ = 0xffffffff;
    }
    else {
      puVar21 = local_1e8 + 0xc;
      local_1b8 = (undefined1  [16])0x0;
      local_1c8 = (undefined1  [16])0x0;
      local_1d8 = (undefined1  [16])0x0;
      local_1e8 = (undefined1  [16])0x0;
      ppRVar30 = (cpi->common).ref_frame_map;
      lVar29 = 1;
      uVar54 = 0;
      do {
        ppRVar30 = ppRVar30 + 1;
        uVar48 = 6;
        if (6 < uVar54) {
          uVar48 = uVar54;
        }
        if (*(int *)(local_1e8 + uVar54 * 8 + 4) != -1) {
          pRVar7 = (cpi->common).ref_frame_map[uVar54];
          if (pRVar7 == (RefCntBuffer *)0x0) {
            *(undefined4 *)(local_1e8 + uVar54 * 8 + 4) = 0xffffffff;
            uVar20 = 0xffffffff;
          }
          else {
            if ((uVar54 != 7) && (1 < pRVar7->ref_count)) {
              lVar51 = 0;
              do {
                if (ppRVar30[lVar51] == pRVar7) {
                  *(undefined8 *)(puVar21 + lVar51 * 8 + -4) = 0xffffffffffffffff;
                }
                lVar51 = lVar51 + 1;
              } while (uVar48 + lVar29 != lVar51);
            }
            *(uint *)(local_1e8 + uVar54 * 8 + 4) = pRVar7->display_order_hint;
            uVar20 = pRVar7->pyramid_level;
          }
          *(uint *)(local_1e8 + uVar54 * 8) = uVar20;
        }
        uVar54 = uVar54 + 1;
        puVar21 = puVar21 + 8;
        lVar29 = lVar29 + -1;
      } while (uVar54 != 8);
    }
    pEVar38 = frame_params;
    pMVar43 = &local_130;
    for (lVar29 = 0x13; FVar1 = (FRAME_TYPE)local_130.current_qindex, lVar29 != 0;
        lVar29 = lVar29 + -1) {
      uVar13 = *(undefined1 *)((long)&pEVar38->error_resilient_mode + 1);
      uVar14 = *(undefined1 *)((long)&pEVar38->error_resilient_mode + 2);
      uVar15 = *(undefined1 *)((long)&pEVar38->error_resilient_mode + 3);
      pMVar43->bsize = *(undefined1 *)&pEVar38->error_resilient_mode;
      pMVar43->partition = uVar13;
      pMVar43->mode = uVar14;
      pMVar43->uv_mode = uVar15;
      pEVar38 = (EncodeFrameParams *)((long)pEVar38 + (ulong)bVar46 * -8 + 4);
      pMVar43 = (MB_MODE_INFO *)((long)pMVar43 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    uVar20 = 0xffffffff;
    lVar29 = 0x1e090;
    lVar51 = 0;
    uVar40 = 0;
    do {
      if (FVar1 == '\0') {
        pTVar8 = (pAVar35->tpl_data).tpl_frame;
        *(undefined4 *)((long)pTVar8->ref_map_index + lVar51 + -0x28) = 0;
        *(undefined1 (*) [16])((long)pTVar8->ref_map_index + lVar51 + -0x70) = (undefined1  [16])0x0
        ;
        uVar50 = uVar20;
      }
      else {
        pTVar8 = (pAVar35->tpl_data).tpl_frame;
        *(long *)((long)pTVar8->ref_map_index + lVar51 + -0x70) =
             *(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar29 * 2) +
             0x4e0;
        *(long *)((long)pTVar8->ref_map_index + lVar51 + -0x68) =
             *(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar29 * 2) +
             0x4e0;
        *(undefined4 *)((long)pTVar8->ref_map_index + lVar51 + -0x28) =
             *(undefined4 *)
              (*(long *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar29 * 2) +
              0x24);
        uVar50 = ~uVar40;
      }
      *(uint *)((long)auStackY_1e1f8 + lVar29) = uVar50;
      uVar40 = uVar40 + 1;
      uVar20 = uVar20 - 1;
      lVar51 = lVar51 + -0x60;
      lVar29 = lVar29 + 4;
    } while (lVar51 != -0x300);
    uVar20 = (pAVar6->gf_group).size;
    uVar40 = 0x5f;
    if ((int)uVar20 < 0x5f) {
      uVar40 = uVar20;
    }
    if ((int)uVar20 < 1) {
      iVar32 = 0;
      local_298 = 0;
      local_280 = 0;
      pAVar44 = pAVar35;
    }
    else {
      lVar29 = 0x20;
      iVar32 = 0;
      local_298 = 0;
      iVar27 = 0;
      do {
        pTVar8 = (pAVar35->tpl_data).tpl_frame;
        bVar46 = (pAVar6->gf_group).update_type[local_298];
        local_130._16_4_ = ZEXT14(bVar46 != 6 && bVar46 != 3);
        local_130._24_4_ = ZEXT14((bVar46 & 0xfe) == 4);
        local_130.current_qindex._0_1_ = (pAVar6->gf_group).frame_type[local_298];
        if (bVar46 == 1) {
          iVar32 = (pAVar6->gf_group).q_val[local_298];
        }
        iVar33 = (uint)(pAVar6->gf_group).arf_src_offset[local_298] +
                 (uint)(pAVar6->gf_group).cur_frame_idx[local_298];
        plVar22 = av1_lookahead_peek(cpi->ppi->lookahead,iVar33,cpi->compressor_stage);
        pAVar44 = cpi->ppi;
        if (plVar22 == (lookahead_entry *)0x0) goto LAB_00237c64;
        pTVar8[local_298].gf_picture = &plVar22->img;
        iVar39 = (int)local_298;
        pYVar23 = av1_tf_info_get_filtered_buf(&pAVar44->tf_info,iVar39,&local_140);
        if (pYVar23 != (YV12_BUFFER_CONFIG *)0x0) {
          pTVar8[local_298].gf_picture = pYVar23;
        }
        uVar34 = iVar33 + (cpi->common).current_frame.frame_number;
        pTVar8[local_298].frame_display_index = uVar34;
        if ((byte)(bVar46 - 6) < 0xfe) {
          pTVar8[local_298].rec_picture = (pAVar35->tpl_data).tpl_rec_pool + iVar27;
          pTVar8[local_298].tpl_stats_ptr = (pAVar35->tpl_data).tpl_stats_pool[iVar27];
          iVar27 = iVar27 + 1;
        }
        av1_get_ref_frames((RefFrameMapPair *)local_1e8,uVar34,cpi,iVar39,0,(int *)local_208);
        iVar33 = av1_get_refresh_frame_flags
                           (cpi,(EncodeFrameParams *)&local_130,bVar46,iVar39,uVar34,
                            (RefFrameMapPair *)local_1e8);
        if ((cpi->ppi->gf_group).is_frame_non_ref[local_298] != false) {
          iVar33 = 0;
        }
        iVar18 = av1_get_refresh_ref_frame_map(iVar33);
        lVar51 = (long)iVar18;
        if (iVar18 != -1 && iVar18 < 8) {
          bVar55 = uVar34 != 0;
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          *(uint32_t *)(local_1e8 + lVar51 * 8 + 4) = uVar34;
          iVar18 = 1;
          if (bVar55) {
            iVar19 = (pAVar6->gf_group).layer_depth[local_298];
            if (iVar19 == 6) {
              iVar18 = (cpi->ppi->gf_group).max_layer_depth;
            }
            else if ((iVar19 != 7) && (iVar18 = iVar19, iVar19 < 2)) {
              iVar18 = 1;
            }
          }
          *(int *)(local_1e8 + lVar51 * 8) = iVar18;
        }
        lVar31 = 0;
        do {
          *(undefined4 *)((long)pTVar8->ref_map_index + lVar31 * 4 + lVar29 + -0x20) =
               *(undefined4 *)((long)local_168 + (long)(int)local_208[lVar31] * 4);
          lVar31 = lVar31 + 1;
        } while (lVar31 != 7);
        if (iVar33 != 0) {
          *(int *)((long)local_168 + lVar51 * 4) = iVar39;
        }
        local_298 = local_298 + 1;
        lVar29 = lVar29 + 0x60;
      } while (local_298 != uVar40);
      pAVar44 = cpi->ppi;
      local_298 = (ulong)uVar40;
LAB_00237c64:
      local_280 = (long)iVar27;
    }
    iVar33 = (cpi->oxcf).gf_cfg.lag_in_frames + -0x20;
    iVar27 = (cpi->rc).frames_to_key - (pAVar44->p_rc).baseline_gf_interval;
    if (iVar33 < iVar27) {
      iVar27 = iVar33;
    }
    if (((uint)local_298 < 0x60) && (0 < iVar27)) {
      iVar33 = (uint)(pAVar6->gf_group).cur_frame_idx[(long)(int)uVar40 + -1] +
               (uint)(pAVar6->gf_group).arf_src_offset[(long)(int)uVar40 + -1];
      lVar29 = (local_298 & 0xffffffff) * 0x60 + 0x20;
      iVar39 = 0;
      uVar54 = local_298 & 0xffffffff;
      do {
        iVar33 = iVar33 + 1;
        pTVar8 = (pAVar35->tpl_data).tpl_frame;
        local_130.ref_frame[0] = '\x01';
        local_130.ref_frame[1] = '\0';
        local_130._18_2_ = 0;
        local_130.motion_mode = '\0';
        local_130.num_proj_ref = '\0';
        local_130.overlappable_neighbors = '\0';
        local_130._27_1_ = 0;
        local_130.current_qindex._0_1_ = '\x01';
        plVar22 = av1_lookahead_peek(cpi->ppi->lookahead,iVar33,cpi->compressor_stage);
        local_298 = uVar54;
        if (plVar22 == (lookahead_entry *)0x0) break;
        pTVar8[uVar54].gf_picture = &plVar22->img;
        pTVar8[uVar54].rec_picture = (pAVar35->tpl_data).tpl_rec_pool + local_280;
        pTVar8[uVar54].tpl_stats_ptr = (pAVar35->tpl_data).tpl_stats_pool[local_280];
        pTVar8[uVar54].frame_display_index = (cpi->common).current_frame.frame_number + iVar33;
        (pAVar6->gf_group).update_type[uVar54] = '\x01';
        (pAVar6->gf_group).q_val[uVar54] = iVar32;
        uVar34 = pTVar8[uVar54].frame_display_index;
        iVar53 = (int)uVar54;
        av1_get_ref_frames((RefFrameMapPair *)local_1e8,uVar34,cpi,iVar53,0,(int *)local_208);
        iVar18 = av1_get_refresh_frame_flags
                           (cpi,(EncodeFrameParams *)&local_130,'\x01',iVar53,uVar34,
                            (RefFrameMapPair *)local_1e8);
        iVar19 = av1_get_refresh_ref_frame_map(iVar18);
        lVar51 = (long)iVar19;
        if (iVar19 != -1 && iVar19 < 8) {
          bVar55 = uVar34 != 0;
          if ((int)uVar34 < 1) {
            uVar34 = 0;
          }
          *(uint32_t *)(local_1e8 + lVar51 * 8 + 4) = uVar34;
          iVar19 = 1;
          if (bVar55) {
            iVar28 = (pAVar6->gf_group).layer_depth[uVar54];
            if (iVar28 == 6) {
              iVar19 = (cpi->ppi->gf_group).max_layer_depth;
            }
            else if ((iVar28 != 7) && (iVar19 = iVar28, iVar28 < 2)) {
              iVar19 = 1;
            }
          }
          *(int *)(local_1e8 + lVar51 * 8) = iVar19;
        }
        local_280 = local_280 + 1;
        lVar31 = 0;
        do {
          *(undefined4 *)((long)pTVar8->ref_map_index + lVar31 * 4 + lVar29 + -0x20) =
               *(undefined4 *)((long)local_168 + (long)(int)local_208[lVar31] * 4);
          lVar31 = lVar31 + 1;
        } while (lVar31 != 7);
        pTVar8[uVar54].ref_map_index[6] = -1;
        pTVar8[uVar54].ref_map_index[2] = -1;
        pTVar8[uVar54].ref_map_index[4] = -1;
        pTVar8[uVar54].ref_map_index[5] = -1;
        if (iVar18 != 0) {
          *(int *)((long)local_168 + lVar51 * 4) = iVar53;
        }
        local_298 = uVar54 + 1;
        if (0x5e < uVar54) break;
        iVar39 = iVar39 + 1;
        lVar29 = lVar29 + 0x60;
        uVar54 = local_298;
      } while (iVar39 < iVar27);
    }
    (cpi->ppi->p_rc).base_layer_qp = iVar32;
    av1_init_tpl_stats(tpl_data);
    uVar20 = (uint)(pAVar6->tpl_data).tpl_bsize_1d;
    iVar27 = uVar20 * uVar20;
    uVar54 = (ulong)(uint)(iVar27 * 2);
    puVar24 = (uint8_t *)aom_memalign(0x20,uVar54);
    (cpi->td).tpl_tmp_buffers.predictor8 = puVar24;
    piVar25 = (int16_t *)aom_memalign(0x20,uVar54);
    (cpi->td).tpl_tmp_buffers.src_diff = piVar25;
    uVar54 = (ulong)(uint)(iVar27 * 4);
    ptVar26 = (tran_low_t *)aom_memalign(0x20,uVar54);
    (cpi->td).tpl_tmp_buffers.coeff = ptVar26;
    ptVar26 = (tran_low_t *)aom_memalign(0x20,uVar54);
    (cpi->td).tpl_tmp_buffers.qcoeff = ptVar26;
    ptVar26 = (tran_low_t *)aom_memalign(0x20,uVar54);
    (cpi->td).tpl_tmp_buffers.dqcoeff = ptVar26;
    puVar24 = (cpi->td).tpl_tmp_buffers.predictor8;
    if ((((puVar24 == (uint8_t *)0x0) || ((cpi->td).tpl_tmp_buffers.src_diff == (int16_t *)0x0)) ||
        ((cpi->td).tpl_tmp_buffers.coeff == (tran_low_t *)0x0)) ||
       (((cpi->td).tpl_tmp_buffers.qcoeff == (tran_low_t *)0x0 || (ptVar26 == (tran_low_t *)0x0))))
    {
      aom_free(puVar24);
      (cpi->td).tpl_tmp_buffers.predictor8 = (uint8_t *)0x0;
      aom_free((cpi->td).tpl_tmp_buffers.src_diff);
      (cpi->td).tpl_tmp_buffers.src_diff = (int16_t *)0x0;
      aom_free((cpi->td).tpl_tmp_buffers.coeff);
      (cpi->td).tpl_tmp_buffers.coeff = (tran_low_t *)0x0;
      aom_free((cpi->td).tpl_tmp_buffers.qcoeff);
      (cpi->td).tpl_tmp_buffers.qcoeff = (tran_low_t *)0x0;
      aom_free((cpi->td).tpl_tmp_buffers.dqcoeff);
      (cpi->td).tpl_tmp_buffers.dqcoeff = (tran_low_t *)0x0;
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Error allocating tpl data");
    }
    (cpi->mt_info).tpl_row_mt.sync_read_ptr = av1_tpl_row_mt_sync_read_dummy;
    (cpi->mt_info).tpl_row_mt.sync_write_ptr = av1_tpl_row_mt_sync_write_dummy;
    iVar27 = (cpi->common).width;
    iVar33 = (cpi->common).height;
    av1_setup_scale_factors_for_frame(&(cpi->common).sf_identity,iVar27,iVar33,iVar27,iVar33);
    if (frame_params->frame_type == '\0') {
      av1_init_mv_probs(&cpi->common);
    }
    av1_fill_mv_costs(&((cpi->common).fc)->nmvc,
                      (uint)(cpi->common).features.cur_frame_force_integer_mv,
                      (uint)(cpi->common).features.allow_high_precision_mv,(cpi->td).mb.mv_costs);
    local_250 = 1;
    if ((cpi->sf).tpl_sf.use_y_only_rate_distortion == 0) {
      local_250 = (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
    }
    bVar46 = cpi->gf_frame_index;
    uVar54 = (ulong)bVar46;
    dVar57 = 1.0;
    iVar27 = (int)local_298;
    if ((((cpi->sf).tpl_sf.reduce_num_frames == 0) ||
        ((pAVar6->gf_group).update_type[uVar54] == '\0')) ||
       ((pAVar6->gf_group).max_layer_depth < 3)) {
      bVar55 = false;
    }
    else {
      dVar57 = 1.6;
      bVar55 = true;
    }
    (pAVar6->tpl_data).r0_adjust_factor = dVar57;
    if ((int)(uint)bVar46 < iVar27) {
      local_1a0 = &(cpi->td).tpl_tmp_buffers;
      local_180 = &(cpi->td).mb.e_mbd.tile;
      local_188 = &(cpi->td).mb.sadperbit;
      local_190 = (cpi->td).tpl_txfm_stats.abs_coeff_sum;
      local_198 = &(cpi->td).mb.mbmi_ext;
      local_1a8 = &(cpi->td).mb;
      lVar29 = (ulong)((uint)bVar46 * 0x60) + 0x20;
      do {
        iVar33 = (pAVar6->gf_group).size;
        if (0x5e < iVar33) {
          iVar33 = 0x5f;
        }
        bVar46 = (pAVar6->gf_group).update_type[uVar54];
        if ((((bVar46 & 0xfe) != 4) &&
            ((gop_eval < 2 ||
             ((long)uVar54 < (long)iVar33 &&
              (pAVar6->gf_group).layer_depth[uVar54] <= (int)(gop_eval == 2 | 2))))) &&
           ((!bVar55 || (bVar46 != 1 || (long)iVar33 <= (long)uVar54)))) {
          pAVar35 = cpi->ppi;
          bVar16 = false;
          if ((0 < (cpi->sf).inter_sf.selective_ref_frame) &&
             (0 < (cpi->sf).tpl_sf.prune_ref_frames_in_tpl)) {
            bVar46 = (pAVar35->gf_group).update_type[uVar54 & 0xff];
            bVar16 = bVar46 != 0 && (bVar46 & 0xfe) != 2;
          }
          pTVar9 = (pAVar35->tpl_data).tpl_frame;
          local_178 = uVar54 * 0x60;
          pTVar8 = pTVar9 + uVar54;
          pYVar23 = pTVar9[uVar54].gf_picture;
          iVar33 = (pAVar35->gf_group).size;
          (pAVar35->tpl_data).frame_idx = (int)uVar54;
          (pAVar35->tpl_data).src_ref_frame[0] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).src_ref_frame[1] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).src_ref_frame[2] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).src_ref_frame[3] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).src_ref_frame[4] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).src_ref_frame[5] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).src_ref_frame[6] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).ref_frame[0] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).ref_frame[1] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).ref_frame[2] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).ref_frame[3] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).ref_frame[4] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).ref_frame[5] = (YV12_BUFFER_CONFIG *)0x0;
          (pAVar35->tpl_data).ref_frame[6] = (YV12_BUFFER_CONFIG *)0x0;
          av1_tile_init(local_180,&cpi->common,0,0);
          iVar39 = (cpi->ppi->p_rc).gfu_boost;
          iVar18 = (pAVar35->gf_group).layer_depth[cpi->gf_frame_index];
          FVar1 = (cpi->common).current_frame.frame_type;
          sf = &(pAVar35->tpl_data).sf;
          iVar19 = (pYVar23->field_2).field_0.y_crop_width;
          iVar53 = (pYVar23->field_3).field_0.y_crop_height;
          av1_setup_scale_factors_for_frame(sf,iVar19,iVar53,iVar19,iVar53);
          (cpi->td).mb.e_mbd.cur_buf = pYVar23;
          pTVar10 = (pAVar35->tpl_data).tpl_frame;
          lVar51 = 0;
          do {
            iVar19 = *(int *)((long)pTVar9->ref_map_index + lVar51 * 4 + lVar29 + -0x20);
            (pAVar35->tpl_data).ref_frame[lVar51] = pTVar10[iVar19].rec_picture;
            (pAVar35->tpl_data).src_ref_frame[lVar51] = pTVar10[iVar19].gf_picture;
            local_208[lVar51] = pTVar10[iVar19].frame_display_index;
            lVar51 = lVar51 + 1;
          } while (lVar51 != 7);
          if (0x5e < iVar33) {
            iVar33 = 0x5f;
          }
          lVar51 = 0;
          do {
            *(YV12_BUFFER_CONFIG **)(local_1e8 + lVar51 * 8) =
                 (pAVar35->tpl_data).src_ref_frame[(long)"\x01\a\x05\x04\x06\x02\x03"[lVar51] + 6];
            lVar51 = lVar51 + 1;
          } while (lVar51 != 7);
          iVar19 = iVar39 / 100;
          if (0x63f < iVar39) {
            iVar19 = 0xf;
          }
          if (5 < iVar18) {
            iVar18 = 6;
          }
          aVar4 = (cpi->oxcf).pass;
          if (((aVar4 == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
             ((cpi->oxcf).mode == '\x01')) {
            bVar56 = (cpi->oxcf).gf_cfg.lag_in_frames == 0;
          }
          else {
            bVar56 = false;
          }
          uVar20 = (cpi->ext_flags).ref_frame_flags;
          lVar51 = 1;
          do {
            uVar40 = (uint)lVar51;
            if (lVar51 == 3 && bVar56) {
              uVar40 = (cpi->sf).rt_sf.use_nonrd_altref_frame + 1;
            }
            if (0 < (int)uVar40) {
              uVar48 = 0;
              do {
                if ((*(long *)(local_1e8 + lVar51 * 8) == *(long *)(local_1e8 + uVar48 * 8)) &&
                   ((uVar20 >> ((byte)("\x01\a\x05\x04\x06\x02\x03"[uVar48] - 1) & 0x1f) & 1) != 0))
                {
                  uVar20 = uVar20 & ~(1 << ((byte)("\x01\a\x05\x04\x06\x02\x03"[lVar51] - 1) & 0x1f)
                                     );
                  break;
                }
                uVar48 = uVar48 + 1;
              } while (uVar40 != uVar48);
            }
            lVar51 = lVar51 + 1;
          } while (lVar51 != 7);
          uVar40 = 0;
          lVar51 = 1;
          do {
            uVar40 = (uVar40 + 1) - (uint)((""[lVar51] & uVar20) == 0);
            lVar51 = lVar51 + 1;
          } while (lVar51 != 8);
          uVar50 = (cpi->oxcf).ref_frm_cfg.max_reference_frames;
          uVar5 = (cpi->sf).inter_sf.selective_ref_frame;
          uVar47 = 7;
          if (2 < (int)uVar5) {
            uVar47 = 4;
            if (((uVar5 < 6) && (uVar47 = 6, uVar5 == 5)) && ((uVar20 & 2) != 0)) {
              uVar47 = local_208[1] - pTVar8->frame_display_index;
              uVar12 = -uVar47;
              if (0 < (int)uVar47) {
                uVar12 = uVar47;
              }
              uVar47 = 5;
              if ((uVar12 < 3) && (uVar47 = 6, AOM_RC_FIRST_PASS < aVar4)) {
                pSVar11 = (cpi->ppi->twopass).stats_buf_ctx;
                pFVar45 = pSVar11->stats_in_start + pTVar8->frame_display_index;
                pFVar49 = (FIRSTPASS_STATS *)0x0;
                if (pFVar45 <= pSVar11->stats_in_end) {
                  pFVar49 = pFVar45;
                }
                uVar47 = (100.0 < pFVar49->coded_error || pFVar49->coded_error == 100.0) + 5;
              }
            }
          }
          if (uVar47 < uVar50) {
            uVar50 = uVar47;
          }
          if (uVar50 < uVar40) {
            uVar48 = 0;
            do {
              if ((uVar20 & ""["\x03\x02\x06\x05"[uVar48]]) != 0) {
                bVar46 = "\x03\x02\x06\x05"[uVar48] - 2;
                if ((bVar46 < 5) && ((0x1bU >> (bVar46 & 0x1f) & 1) != 0)) {
                  uVar20 = uVar20 & (&DAT_00509da8)[bVar46];
                }
                uVar40 = uVar40 - 1;
              }
            } while ((uVar48 < 3) && (uVar48 = uVar48 + 1, (int)uVar50 < (int)uVar40));
          }
          lVar51 = 0;
          do {
            if ((uVar20 >> ((uint)lVar51 & 0x1f) & 1) == 0) {
              (pAVar35->tpl_data).ref_frame[lVar51] = (YV12_BUFFER_CONFIG *)0x0;
            }
            lVar51 = lVar51 + 1;
          } while (lVar51 != 7);
          if ((bool)(bVar16 & (long)uVar54 < (long)iVar33)) {
            lVar51 = 0;
            do {
              lVar31 = lVar51 + 1;
              if (1 < (int)uVar5) {
                lVar52 = 3;
                bVar16 = true;
                do {
                  bVar56 = bVar16;
                  if ((lVar52 == lVar31) && ((int)local_208[lVar51] < (int)local_208[3]))
                  goto LAB_00238630;
                  lVar52 = 2;
                  bVar16 = false;
                } while (bVar56);
                if (2 < (int)uVar5) {
                  lVar52 = 6;
                  bVar16 = true;
                  do {
                    while (lVar52 != lVar31) {
                      lVar52 = 5;
                      bVar56 = !bVar16;
                      bVar16 = false;
                      if (bVar56) goto LAB_0023863c;
                    }
                    lVar52 = 5;
                    bVar56 = (bool)(bVar16 & (int)local_208[0] <= (int)local_208[lVar51]);
                    bVar16 = false;
                  } while (bVar56);
                  if ((int)local_208[lVar51] < (int)local_208[0]) {
LAB_00238630:
                    (pAVar35->tpl_data).ref_frame[lVar51] = (YV12_BUFFER_CONFIG *)0x0;
                  }
                }
              }
LAB_0023863c:
              lVar51 = lVar31;
            } while (lVar31 != 7);
          }
          memset(&local_130,0,0xb0);
          (cpi->td).mb.e_mbd.mi = local_168;
          (cpi->td).mb.e_mbd.block_ref_scale_factors[0] = sf;
          (cpi->td).mb.e_mbd.block_ref_scale_factors[1] = sf;
          iVar33 = iVar32;
          if (cpi->use_ducky_encode != 0) {
            iVar33 = (pAVar35->gf_group).q_val[uVar54];
          }
          bVar16 = AOM_RC_FIRST_PASS < aVar4;
          if (aVar4 == AOM_RC_ONE_PASS) {
            if (cpi->compressor_stage == '\0') {
              bVar16 = cpi->ppi->lap_enabled != 0;
            }
            else {
              bVar16 = false;
            }
          }
          local_168[0] = &local_130;
          uVar20 = av1_compute_rd_mult(iVar33,((cpi->common).seq_params)->bit_depth,
                                       (cpi->ppi->gf_group).update_type[cpi->gf_frame_index],iVar18,
                                       iVar19,FVar1,(cpi->oxcf).q_cfg.use_fixed_qp_offsets,
                                       (uint)bVar16,(cpi->oxcf).tune_cfg.tuning);
          if ((int)uVar20 < 2) {
            uVar20 = 0;
          }
          (cpi->td).mb.errorperbit = (uVar20 >> 6) + (uint)(uVar20 >> 6 == 0);
          av1_set_sad_per_bit(cpi,local_188,iVar33);
          pTVar8->is_valid = '\x01';
          (cpi->common).quant_params.base_qindex = iVar33;
          av1_frame_init_quantizer(cpi);
          iVar33 = av1_compute_rd_mult_based_on_qindex
                             ((cpi->td).mb.e_mbd.bd,
                              (pAVar35->gf_group).update_type[cpi->gf_frame_index],iVar33,
                              (cpi->oxcf).tune_cfg.tuning);
          pTVar8->base_rdmult = iVar33 / 6;
          if (cpi->use_ducky_encode != 0) {
            pTVar8->base_rdmult = (pAVar35->gf_group).rdmult_val[uVar54];
          }
          (cpi->td).tpl_txfm_stats.ready = 0;
          (cpi->td).tpl_txfm_stats.coeff_num = 0x100;
          memset(local_190,0,0x1004);
          if ((cpi->sf).tpl_sf.allow_compound_pred != 0) {
            memset(local_198,0,0x504);
          }
          tpl_tmp_buffers = local_1a0;
          x = local_1a8;
          (cpi->td).mb.e_mbd.mi = (MB_MODE_INFO **)0x0;
          iVar33 = (cpi->sf).tpl_sf.use_sad_for_mode_decision;
          uVar20 = 0;
          if ((iVar33 != 0) && ((pAVar35->gf_group).update_type[cpi->gf_frame_index] != '\0')) {
            uVar20 = (uint)(iVar33 == 1);
            iVar33 = (pAVar35->gf_group).layer_depth[uVar54];
            uVar20 = (uint)(SBORROW4(iVar33,uVar20 * 5) == (int)(iVar33 + uVar20 * -5) < 0);
          }
          pTVar8->use_pred_sad = uVar20;
          local_170 = lVar29;
          if ((cpi->mt_info).num_workers < 2) {
            bVar46 = (cpi->ppi->tpl_data).tpl_bsize_1d;
            if (bVar46 < 0x10) {
              if (bVar46 == 4) {
                bsize = BLOCK_4X4;
              }
              else {
                if (bVar46 != 8) goto LAB_0023895c;
                bsize = BLOCK_8X8;
              }
            }
            else if (bVar46 == 0x10) {
LAB_0023895c:
              bsize = BLOCK_16X16;
            }
            else {
              bsize = BLOCK_64X64;
              if (bVar46 != 0x40) {
                if (bVar46 != 0x20) goto LAB_0023895c;
                bsize = BLOCK_32X32;
              }
            }
            iVar33 = (cpi->common).mi_params.mi_rows;
            if (0 < iVar33) {
              tx_size = ""[bsize];
              bVar46 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [bsize];
              iVar19 = 8;
              iVar18 = 0;
              iVar53 = 0;
              iVar39 = 0;
              do {
                iVar28 = (cpi->ppi->tpl_data).border_in_pixels;
                iVar41 = iVar19 - iVar28;
                iVar36 = (uint)bVar46 + iVar39;
                iVar37 = (uint)bVar46 * -4 + iVar19 + -0x10;
                if (iVar41 <= iVar37) {
                  iVar41 = iVar37;
                }
                (cpi->td).mb.mv_limits.row_min = iVar41;
                iVar41 = (iVar33 + iVar18) - (uint)bVar46;
                iVar28 = iVar28 + iVar41 * 4 + -8;
                iVar33 = (iVar33 + iVar18) * 4 + 8;
                if (iVar28 < iVar33) {
                  iVar33 = iVar28;
                }
                (cpi->td).mb.mv_limits.row_max = iVar33;
                (cpi->td).mb.e_mbd.mb_to_top_edge = iVar53;
                uVar20 = iVar41 * 0x20;
                (cpi->td).mb.e_mbd.mb_to_bottom_edge = uVar20;
                av1_mc_flow_dispenser_row
                          (cpi,(TplTxfmStats *)(ulong)uVar20,tpl_tmp_buffers,x,iVar39,bsize,tx_size)
                ;
                iVar33 = (cpi->common).mi_params.mi_rows;
                iVar19 = iVar19 + (uint)bVar46 * -4;
                iVar53 = iVar53 + (uint)bVar46 * -0x20;
                iVar18 = iVar18 - (uint)bVar46;
                iVar39 = iVar36;
              } while (iVar36 < iVar33);
            }
          }
          else {
            (cpi->mt_info).tpl_row_mt.sync_read_ptr = av1_tpl_row_mt_sync_read;
            (cpi->mt_info).tpl_row_mt.sync_write_ptr = av1_tpl_row_mt_sync_write;
            av1_mc_flow_dispenser_mt(cpi);
          }
          aom_extend_frame_borders_c
                    (*(YV12_BUFFER_CONFIG **)
                      ((long)((pAVar6->tpl_data).tpl_frame)->ref_map_index + local_178 + -8),
                     local_250);
          lVar29 = local_170;
        }
        uVar54 = uVar54 + 1;
        lVar29 = lVar29 + 0x60;
      } while (uVar54 != (local_298 & 0xffffffff));
      bVar46 = cpi->gf_frame_index;
    }
    if ((int)(uint)bVar46 < iVar27) {
      uVar54 = local_298 & 0xffffffff;
      do {
        uVar48 = uVar54 - 1;
        iVar32 = (pAVar6->gf_group).size;
        if (0x5e < iVar32) {
          iVar32 = 0x5f;
        }
        bVar2 = (pAVar6->gf_group).update_type[uVar54 - 1];
        if (((((bVar2 & 0xfe) != 4) &&
             ((gop_eval < 2 ||
              (((pAVar6->gf_group).layer_depth[uVar54 - 1] <= (int)(gop_eval == 2 | 2) &&
               ((long)uVar54 <= (long)iVar32)))))) &&
            ((!bVar55 || (bVar2 != 1 || (long)iVar32 < (long)uVar54)))) && (uVar48 != 0)) {
          bVar2 = (pAVar6->tpl_data).tpl_bsize_1d;
          if (bVar2 < 0x10) {
            if (bVar2 == 4) {
              lVar29 = 0;
            }
            else {
              if (bVar2 != 8) goto LAB_00238bce;
              lVar29 = 3;
            }
          }
          else if (bVar2 == 0x10) {
LAB_00238bce:
            lVar29 = 6;
          }
          else {
            lVar29 = 0xc;
            if (bVar2 != 0x40) {
              if (bVar2 != 0x20) goto LAB_00238bce;
              lVar29 = 9;
            }
          }
          iVar32 = (cpi->common).mi_params.mi_rows;
          if (0 < iVar32) {
            iVar33 = (cpi->common).mi_params.mi_cols;
            bVar46 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [lVar29];
            bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [lVar29];
            iVar39 = 0;
            do {
              if (0 < iVar33) {
                iVar18 = 0;
                do {
                  bVar3 = (pAVar6->tpl_data).tpl_stats_block_mis_log2;
                  iVar19 = 4 << (bVar3 & 0x1f);
                  if (iVar19 < 0x10) {
                    if (iVar19 == 4) {
                      bVar17 = 0;
                    }
                    else {
                      if (iVar19 != 8) goto LAB_00238c5d;
                      bVar17 = 3;
                    }
                  }
                  else if (iVar19 == 0x10) {
LAB_00238c5d:
                    bVar17 = 6;
                  }
                  else {
                    bVar17 = 0xc;
                    if (iVar19 != 0x40) {
                      if (iVar19 != 0x20) goto LAB_00238c5d;
                      bVar17 = 9;
                    }
                  }
                  tpl_model_update_b((TplParams *)(ulong)bVar3,(int)(pAVar6->tpl_data).tpl_frame,
                                     iVar39,(BLOCK_SIZE)iVar18,(uint)bVar17,(int)uVar48);
                  uVar20._0_1_ = (pAVar6->tpl_data).tpl_stats_block_mis_log2;
                  uVar20._1_1_ = (pAVar6->tpl_data).tpl_bsize_1d;
                  uVar20._2_2_ = *(undefined2 *)&(pAVar6->tpl_data).field_0x6;
                  tpl_model_update_b((TplParams *)(ulong)uVar20,(int)(pAVar6->tpl_data).tpl_frame,
                                     iVar39,(BLOCK_SIZE)iVar18,(uint)bVar17,(int)uVar48);
                  iVar18 = iVar18 + (uint)bVar2;
                } while (iVar18 < iVar33);
              }
              iVar39 = iVar39 + (uint)bVar46;
            } while (iVar39 < iVar32);
            bVar46 = cpi->gf_frame_index;
          }
        }
        uVar54 = uVar48;
      } while ((long)(ulong)bVar46 < (long)uVar48);
    }
    type = (pAVar6->gf_group).update_type[bVar46];
    uVar20 = 0;
    av1_configure_buffer_updates(cpi,local_38,type,type,0);
    (cpi->common).current_frame.frame_type = frame_params->frame_type;
    (cpi->common).show_frame = frame_params->show_frame;
    aom_free((cpi->td).tpl_tmp_buffers.predictor8);
    (cpi->td).tpl_tmp_buffers.predictor8 = (uint8_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.src_diff);
    (cpi->td).tpl_tmp_buffers.src_diff = (int16_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.coeff);
    (cpi->td).tpl_tmp_buffers.coeff = (tran_low_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.qcoeff);
    (cpi->td).tpl_tmp_buffers.qcoeff = (tran_low_t *)0x0;
    aom_free((cpi->td).tpl_tmp_buffers.dqcoeff);
    (cpi->td).tpl_tmp_buffers.dqcoeff = (tran_low_t *)0x0;
    if (gop_eval < 2) {
      tpl_data->ready = 1;
    }
    if ((cpi->common).tiles.large_scale == 0) {
      if ((pAVar6->gf_group).max_layer_depth_allowed == 0) {
        uVar20 = 1;
      }
      else if (gop_eval != 0) {
        iVar33 = (pAVar6->gf_group).arf_index;
        iVar32 = iVar33 + 1;
        iVar39 = iVar27 + -1;
        if (iVar32 < iVar27) {
          iVar39 = iVar32;
        }
        dVar57 = get_frame_importance(tpl_data,iVar33);
        dVar58 = get_frame_importance(tpl_data,iVar39);
        if (gop_eval == 3) {
          uVar20 = (uint)(1.1 < dVar57);
        }
        else if (gop_eval == 2) {
          if ((dVar57 <= 1.6) || (uVar20 = 1, dVar57 < dVar58 + 0.4)) {
            uVar20 = (-(uint)(dVar58 + 0.1 <= dVar57 && 1.4 < dVar57) & 1) * 2;
          }
        }
        else {
          uVar20 = 2;
          if (gop_eval == 1) {
            uVar20 = -(uint)(3.0 < dVar57 && dVar58 + 0.7 <= dVar57) & 1;
          }
        }
      }
    }
  }
  else {
    av1_init_tpl_stats(tpl_data);
    uVar20 = 0;
  }
  return uVar20;
}

Assistant:

int av1_tpl_setup_stats(AV1_COMP *cpi, int gop_eval,
                        const EncodeFrameParams *const frame_params) {
#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_tpl_setup_stats_time);
#endif
  assert(cpi->gf_frame_index == 0);
  AV1_COMMON *cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &mt_info->tpl_row_mt;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  EncodeFrameParams this_frame_params = *frame_params;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  int approx_gop_eval = (gop_eval > 1);

  if (cpi->superres_mode != AOM_SUPERRES_NONE) {
    assert(cpi->superres_mode != AOM_SUPERRES_AUTO);
    av1_init_tpl_stats(tpl_data);
    return 0;
  }

  cm->current_frame.frame_type = frame_params->frame_type;
  for (int gf_index = cpi->gf_frame_index; gf_index < gf_group->size;
       ++gf_index) {
    cm->current_frame.frame_type = gf_group->frame_type[gf_index];
    av1_configure_buffer_updates(cpi, &this_frame_params.refresh_frame,
                                 gf_group->update_type[gf_index],
                                 gf_group->refbuf_state[gf_index], 0);

    memcpy(&cpi->refresh_frame, &this_frame_params.refresh_frame,
           sizeof(cpi->refresh_frame));
  }

  int pframe_qindex;
  int tpl_gf_group_frames;
  init_gop_frames_for_tpl(cpi, frame_params, gf_group, &tpl_gf_group_frames,
                          &pframe_qindex);

  cpi->ppi->p_rc.base_layer_qp = pframe_qindex;

  av1_init_tpl_stats(tpl_data);

  TplBuffers *tpl_tmp_buffers = &cpi->td.tpl_tmp_buffers;
  if (!tpl_alloc_temp_buffers(tpl_tmp_buffers, tpl_data->tpl_bsize_1d)) {
    aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                       "Error allocating tpl data");
  }

  tpl_row_mt->sync_read_ptr = av1_tpl_row_mt_sync_read_dummy;
  tpl_row_mt->sync_write_ptr = av1_tpl_row_mt_sync_write_dummy;

  av1_setup_scale_factors_for_frame(&cm->sf_identity, cm->width, cm->height,
                                    cm->width, cm->height);

  if (frame_params->frame_type == KEY_FRAME) {
    av1_init_mv_probs(cm);
  }
  av1_fill_mv_costs(&cm->fc->nmvc, cm->features.cur_frame_force_integer_mv,
                    cm->features.allow_high_precision_mv, cpi->td.mb.mv_costs);

  const int num_planes =
      cpi->sf.tpl_sf.use_y_only_rate_distortion ? 1 : av1_num_planes(cm);
  // As tpl module is called before the setting of speed features at frame
  // level, turning off this speed feature for the first GF group of the
  // key-frame interval is done here.
  int reduce_num_frames =
      cpi->sf.tpl_sf.reduce_num_frames &&
      gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->max_layer_depth > 2;
  // TPL processing is skipped for frames of type LF_UPDATE when
  // 'reduce_num_frames' is 1, which affects the r0 calcuation. Thus, a factor
  // to adjust r0 is used. The value of 1.6 corresponds to using ~60% of the
  // frames in the gf group on an average.
  tpl_data->r0_adjust_factor = reduce_num_frames ? 1.6 : 1.0;

  // Backward propagation from tpl_group_frames to 1.
  for (int frame_idx = cpi->gf_frame_index; frame_idx < tpl_gf_group_frames;
       ++frame_idx) {
    if (skip_tpl_for_frame(gf_group, frame_idx, gop_eval, approx_gop_eval,
                           reduce_num_frames))
      continue;

    init_mc_flow_dispenser(cpi, frame_idx, pframe_qindex);
    if (mt_info->num_workers > 1) {
      tpl_row_mt->sync_read_ptr = av1_tpl_row_mt_sync_read;
      tpl_row_mt->sync_write_ptr = av1_tpl_row_mt_sync_write;
      av1_mc_flow_dispenser_mt(cpi);
    } else {
      mc_flow_dispenser(cpi);
    }
#if CONFIG_BITRATE_ACCURACY
    av1_tpl_txfm_stats_update_abs_coeff_mean(&cpi->td.tpl_txfm_stats);
    av1_tpl_store_txfm_stats(tpl_data, &cpi->td.tpl_txfm_stats, frame_idx);
#endif  // CONFIG_BITRATE_ACCURACY
#if CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY
    if (cpi->oxcf.pass == AOM_RC_THIRD_PASS) {
      int frame_coding_idx =
          av1_vbr_rc_frame_coding_idx(&cpi->vbr_rc_info, frame_idx);
      rc_log_frame_stats(&cpi->rc_log, frame_coding_idx,
                         &cpi->td.tpl_txfm_stats);
    }
#endif  // CONFIG_RATECTRL_LOG

    aom_extend_frame_borders(tpl_data->tpl_frame[frame_idx].rec_picture,
                             num_planes);
  }

  for (int frame_idx = tpl_gf_group_frames - 1;
       frame_idx >= cpi->gf_frame_index; --frame_idx) {
    if (skip_tpl_for_frame(gf_group, frame_idx, gop_eval, approx_gop_eval,
                           reduce_num_frames))
      continue;

    mc_flow_synthesizer(tpl_data, frame_idx, cm->mi_params.mi_rows,
                        cm->mi_params.mi_cols);
  }

  av1_configure_buffer_updates(cpi, &this_frame_params.refresh_frame,
                               gf_group->update_type[cpi->gf_frame_index],
                               gf_group->update_type[cpi->gf_frame_index], 0);
  cm->current_frame.frame_type = frame_params->frame_type;
  cm->show_frame = frame_params->show_frame;

#if CONFIG_COLLECT_COMPONENT_TIMING
  // Record the time if the function returns.
  if (cpi->common.tiles.large_scale || gf_group->max_layer_depth_allowed == 0 ||
      !gop_eval)
    end_timing(cpi, av1_tpl_setup_stats_time);
#endif

  tpl_dealloc_temp_buffers(tpl_tmp_buffers);

  if (!approx_gop_eval) {
    tpl_data->ready = 1;
  }
  if (cpi->common.tiles.large_scale) return 0;
  if (gf_group->max_layer_depth_allowed == 0) return 1;
  if (!gop_eval) return 0;
  assert(gf_group->arf_index >= 0);

  double beta[2] = { 0.0 };
  const int frame_idx_0 = gf_group->arf_index;
  const int frame_idx_1 =
      AOMMIN(tpl_gf_group_frames - 1, gf_group->arf_index + 1);
  beta[0] = get_frame_importance(tpl_data, frame_idx_0);
  beta[1] = get_frame_importance(tpl_data, frame_idx_1);
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_tpl_setup_stats_time);
#endif
  return eval_gop_length(beta, gop_eval);
}